

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spectrum.cpp
# Opt level: O2

PiecewiseLinearSpectrum * __thiscall
pbrt::PiecewiseLinearSpectrum::FromInterleaved
          (PiecewiseLinearSpectrum *this,span<const_float> samples,bool normalize,Allocator alloc)

{
  PiecewiseLinearSpectrum *this_00;
  undefined7 in_register_00000009;
  size_type sVar1;
  size_type __n;
  uintptr_t iptr;
  Float FVar2;
  value_type vb_1;
  value_type va_1;
  vector<float,_std::allocator<float>_> v;
  vector<float,_std::allocator<float>_> lambda;
  Allocator alloc_local;
  SpectrumHandle local_30;
  SpectrumHandle local_28;
  
  alloc_local.memoryResource = (memory_resource *)CONCAT71(in_register_00000009,normalize);
  v.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_start._0_4_
       = 0;
  lambda.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)((ulong)samples.ptr & 1);
  if (((undefined1  [16])samples & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    LogFatal<char_const(&)[2],char_const(&)[19],char_const(&)[2],int&,char_const(&)[19],unsigned_long&>
              (Fatal,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/spectrum.cpp"
               ,0x85,"Check failed: %s == %s with %s = %s, %s = %s",(char (*) [2])0x2c714a2,
               (char (*) [19])"samples.size() % 2",(char (*) [2])0x2c714a2,(int *)&v,
               (char (*) [19])"samples.size() % 2",(unsigned_long *)&lambda);
  }
  __n = (size_type)(int)((ulong)samples.ptr >> 1);
  std::vector<float,_std::allocator<float>_>::vector(&lambda,__n,(allocator_type *)&v);
  std::vector<float,_std::allocator<float>_>::vector(&v,__n,(allocator_type *)&va_1);
  sVar1 = 0;
  do {
    if (__n == sVar1) {
      this_00 = pstd::pmr::polymorphic_allocator<std::byte>::
                new_object<pbrt::PiecewiseLinearSpectrum,std::vector<float,std::allocator<float>>&,std::vector<float,std::allocator<float>>&,pstd::pmr::polymorphic_allocator<std::byte>&>
                          (&alloc_local,&lambda,&v,&alloc_local);
      if ((char)samples.n != '\0') {
        local_28.
        super_TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBAlbedoSpectrum,_pbrt::RGBUnboundedSpectrum,_pbrt::RGBIlluminantSpectrum,_pbrt::BlackbodySpectrum>
        .bits = (TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBAlbedoSpectrum,_pbrt::RGBUnboundedSpectrum,_pbrt::RGBIlluminantSpectrum,_pbrt::BlackbodySpectrum>
                 )((ulong)this_00 | 0x3000000000000);
        local_30.
        super_TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBAlbedoSpectrum,_pbrt::RGBUnboundedSpectrum,_pbrt::RGBIlluminantSpectrum,_pbrt::BlackbodySpectrum>
        .bits = (TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBAlbedoSpectrum,_pbrt::RGBUnboundedSpectrum,_pbrt::RGBIlluminantSpectrum,_pbrt::BlackbodySpectrum>
                 )(Spectra::y | 0x2000000000000);
        FVar2 = InnerProduct(&local_28,&local_30);
        Scale(this_00,1.0 / FVar2);
      }
      std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
                (&v.super__Vector_base<float,_std::allocator<float>_>);
      std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
                (&lambda.super__Vector_base<float,_std::allocator<float>_>);
      return this_00;
    }
    lambda.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_start[sVar1] = *(float *)&(&(this->lambdas).alloc)[sVar1].memoryResource;
    *(undefined4 *)
     (CONCAT44(v.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
               _M_start._4_4_,
               v.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
               _M_start._0_4_) + sVar1 * 4) =
         *(undefined4 *)((long)&(&(this->lambdas).alloc)[sVar1].memoryResource + 4);
    if (sVar1 != 0) {
      va_1 = lambda.super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start[sVar1];
      vb_1 = lambda.super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start[sVar1 - 1];
      if (va_1 <= vb_1) {
        LogFatal<char_const(&)[10],char_const(&)[14],char_const(&)[10],float&,char_const(&)[14],float&>
                  (Fatal,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/spectrum.cpp"
                   ,0x8c,"Check failed: %s > %s with %s = %s, %s = %s",(char (*) [10])"lambda[i]",
                   (char (*) [14])"lambda[i - 1]",(char (*) [10])"lambda[i]",(float *)&va_1,
                   (char (*) [14])"lambda[i - 1]",&vb_1);
      }
    }
    sVar1 = sVar1 + 1;
  } while( true );
}

Assistant:

PiecewiseLinearSpectrum *PiecewiseLinearSpectrum::FromInterleaved(
    pstd::span<const Float> samples, bool normalize, Allocator alloc) {
    CHECK_EQ(0, samples.size() % 2);
    int n = samples.size() / 2;
    std::vector<Float> lambda(n), v(n);
    for (size_t i = 0; i < n; ++i) {
        lambda[i] = samples[2 * i];
        v[i] = samples[2 * i + 1];
        if (i > 0)
            CHECK_GT(lambda[i], lambda[i - 1]);
    }

    PiecewiseLinearSpectrum *spec =
        alloc.new_object<pbrt::PiecewiseLinearSpectrum>(lambda, v, alloc);

    if (normalize)
        // Normalize to have luminance of 1.
        spec->Scale(1 / InnerProduct(spec, &Spectra::Y()));

    return spec;
}